

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O3

S2Point * __thiscall
EncodedS2LaxPolygonShape::loop_vertex
          (S2Point *__return_storage_ptr__,EncodedS2LaxPolygonShape *this,int i,int j)

{
  Format FVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  S2LogMessage SStack_38;
  
  if (i < *(int *)&(this->super_S2Shape).field_0xc) {
    iVar3 = num_loop_vertices(this,i);
    if (j < iVar3) {
      if (*(int *)&(this->super_S2Shape).field_0xc == 1) {
        FVar1 = (this->vertices_).format_;
        if (FVar1 == CELL_IDS) {
LAB_001f884c:
          s2coding::EncodedS2PointVector::DecodeCellIdsFormat
                    (__return_storage_ptr__,&this->vertices_,j);
          return __return_storage_ptr__;
        }
        if (FVar1 == UNCOMPRESSED) {
          pcVar2 = (this->vertices_).field_2.cell_ids_.blocks.offsets_.data_;
          __return_storage_ptr__->c_[2] = *(VType *)(pcVar2 + (long)j * 0x18 + 0x10);
          pcVar2 = pcVar2 + (long)j * 0x18;
          uVar5 = *(undefined4 *)pcVar2;
          uVar6 = *(undefined4 *)(pcVar2 + 4);
          uVar7 = *(undefined4 *)(pcVar2 + 8);
          uVar8 = *(undefined4 *)(pcVar2 + 0xc);
LAB_001f8835:
          *(undefined4 *)__return_storage_ptr__->c_ = uVar5;
          *(undefined4 *)((long)__return_storage_ptr__->c_ + 4) = uVar6;
          *(undefined4 *)(__return_storage_ptr__->c_ + 1) = uVar7;
          *(undefined4 *)((long)__return_storage_ptr__->c_ + 0xc) = uVar8;
          return __return_storage_ptr__;
        }
        S2LogMessage::S2LogMessage
                  (&SStack_38,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.h"
                   ,0x85,kFatal,(ostream *)&std::cerr);
        std::operator<<(SStack_38.stream_,"Unrecognized format");
      }
      else {
        uVar4 = s2coding::EncodedUintVector<unsigned_int>::operator[](&this->cumulative_vertices_,i)
        ;
        j = uVar4 + j;
        FVar1 = (this->vertices_).format_;
        if (FVar1 == CELL_IDS) goto LAB_001f884c;
        if (FVar1 == UNCOMPRESSED) {
          pcVar2 = (this->vertices_).field_2.cell_ids_.blocks.offsets_.data_;
          __return_storage_ptr__->c_[2] = *(VType *)(pcVar2 + (long)j * 0x18 + 0x10);
          pcVar2 = pcVar2 + (long)j * 0x18;
          uVar5 = *(undefined4 *)pcVar2;
          uVar6 = *(undefined4 *)(pcVar2 + 4);
          uVar7 = *(undefined4 *)(pcVar2 + 8);
          uVar8 = *(undefined4 *)(pcVar2 + 0xc);
          goto LAB_001f8835;
        }
        S2LogMessage::S2LogMessage
                  (&SStack_38,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.h"
                   ,0x85,kFatal,(ostream *)&std::cerr);
        std::operator<<(SStack_38.stream_,"Unrecognized format");
      }
    }
    else {
      S2LogMessage::S2LogMessage
                (&SStack_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
                 ,0x114,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_38.stream_,"Check failed: (j) < (num_loop_vertices(i)) ",0x2b);
    }
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0x113,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_38.stream_,"Check failed: (i) < (num_loops()) ",0x22);
  }
  abort();
}

Assistant:

S2Point EncodedS2LaxPolygonShape::loop_vertex(int i, int j) const {
  S2_DCHECK_LT(i, num_loops());
  S2_DCHECK_LT(j, num_loop_vertices(i));
  if (num_loops() == 1) {
    return vertices_[j];
  } else {
    return vertices_[cumulative_vertices_[i] + j];
  }
}